

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O2

char * affinity_mask_str_r(cpu_affinity_mask_t *affinity_mask,char *buffer,uint32_t buffer_len)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  bool bVar8;
  
  uVar7 = 0x1fff;
  uVar6 = 0;
  bVar3 = 0;
  while( true ) {
    uVar4 = (ushort)uVar6;
    iVar2 = (int)(uVar6 & 0xffff);
    if (buffer_len <= iVar2 + 1U) break;
    bVar8 = uVar7 < 4;
    bVar1 = affinity_mask->__bits[uVar7];
    if ((bool)(bVar1 != 0 | bVar3 | bVar8)) {
      snprintf(buffer + (uVar6 & 0xffff),3,"%02X",(ulong)bVar1);
      uVar5 = iVar2 + 2;
      uVar6 = (ulong)uVar5;
      uVar4 = (ushort)uVar5;
      if (uVar7 == 0) break;
    }
    uVar7 = uVar7 - 1;
    bVar3 = bVar1 != 0 | bVar3 | bVar8;
  }
  buffer[uVar4] = '\0';
  return buffer;
}

Assistant:

char* affinity_mask_str_r(cpu_affinity_mask_t* affinity_mask, char* buffer, uint32_t buffer_len)
{
	logical_cpu_t mask_index = __MASK_SETSIZE - 1;
	logical_cpu_t str_index = 0;
	bool do_print = false;

	while (((uint32_t) str_index) + 1 < buffer_len) {
		if (do_print || (mask_index < 4) || (affinity_mask->__bits[mask_index] != 0x00)) {
			snprintf(&buffer[str_index], 3, "%02X", affinity_mask->__bits[mask_index]);
			do_print = true;
			str_index += 2;
		}
		/* mask_index in unsigned, so we cannot decrement it beyond 0 */
		if (mask_index == 0)
			break;
		mask_index--;
	}
	buffer[str_index] = '\0';

	return buffer;
}